

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O0

void sPrint_CompCol_Matrix(char *what,SuperMatrix *A)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  float *dp;
  int n;
  int_t i;
  NCformat *Astore;
  SuperMatrix *A_local;
  char *what_local;
  
  printf("\nCompCol matrix %s:\n",what);
  printf("Stype %d, Dtype %d, Mtype %d\n",(ulong)A->Stype,(ulong)A->Dtype,(ulong)A->Mtype);
  iVar1 = A->ncol;
  piVar2 = (int *)A->Store;
  lVar3 = *(long *)(piVar2 + 2);
  printf("nrow %d, ncol %d, nnz %ld\n",(ulong)(uint)A->nrow,(ulong)(uint)A->ncol,(long)*piVar2);
  printf("nzval: ");
  dp._4_4_ = 0;
  while( true ) {
    if (*(int *)(*(long *)(piVar2 + 6) + (long)iVar1 * 4) <= dp._4_4_) break;
    printf("%f  ",(double)*(float *)(lVar3 + (long)dp._4_4_ * 4));
    dp._4_4_ = dp._4_4_ + 1;
  }
  printf("\nrowind: ");
  dp._4_4_ = 0;
  while( true ) {
    if (*(int *)(*(long *)(piVar2 + 6) + (long)iVar1 * 4) <= dp._4_4_) break;
    printf("%ld  ",(long)*(int *)(*(long *)(piVar2 + 4) + (long)dp._4_4_ * 4));
    dp._4_4_ = dp._4_4_ + 1;
  }
  printf("\ncolptr: ");
  for (dp._4_4_ = 0; dp._4_4_ <= iVar1; dp._4_4_ = dp._4_4_ + 1) {
    printf("%ld  ",(long)*(int *)(*(long *)(piVar2 + 6) + (long)dp._4_4_ * 4));
  }
  printf("\n");
  fflush(_stdout);
  return;
}

Assistant:

void
sPrint_CompCol_Matrix(char *what, SuperMatrix *A)
{
    NCformat     *Astore;
    register int_t i;
    register int n;
    float       *dp;
    
    printf("\nCompCol matrix %s:\n", what);
    printf("Stype %d, Dtype %d, Mtype %d\n", A->Stype,A->Dtype,A->Mtype);
    n = A->ncol;
    Astore = (NCformat *) A->Store;
    dp = (float *) Astore->nzval;
    printf("nrow %d, ncol %d, nnz %ld\n", (int)A->nrow, (int)A->ncol, (long)Astore->nnz);
    printf("nzval: ");
    for (i = 0; i < Astore->colptr[n]; ++i) printf("%f  ", dp[i]);
    printf("\nrowind: ");
    for (i = 0; i < Astore->colptr[n]; ++i) printf("%ld  ", (long)Astore->rowind[i]);
    printf("\ncolptr: ");
    for (i = 0; i <= n; ++i) printf("%ld  ", (long)Astore->colptr[i]);
    printf("\n");
    fflush(stdout);
}